

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

int run_test_udp_open_bound(void)

{
  int iVar1;
  uv_os_sock_t __fd;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  uv_udp_t client;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    __fd = create_udp_socket();
    iVar1 = bind(__fd,(sockaddr *)&addr,0x10);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_udp_init(uVar2,&client);
      if (iVar1 == 0) {
        iVar1 = uv_udp_open(&client,__fd);
        if (iVar1 == 0) {
          iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
          if (iVar1 == 0) {
            uv_close(&client,0);
            uVar2 = uv_default_loop();
            uv_run(uVar2,0);
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0xf8;
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0xf3;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0xf0;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xed;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0xea;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0xe4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_open_bound) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = bind(sock, (struct sockaddr*) &addr, sizeof(addr));
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}